

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O1

Slice __thiscall leveldb::BlockBuilder::Finish(BlockBuilder *this)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  Slice SVar4;
  
  puVar1 = (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish == puVar1) {
    uVar2 = 0;
  }
  else {
    uVar3 = 0;
    do {
      PutFixed32(&this->buffer_,puVar1[uVar3]);
      uVar3 = uVar3 + 1;
      puVar1 = (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = (long)(this->restarts_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
    } while (uVar3 < uVar2);
  }
  PutFixed32(&this->buffer_,(uint32_t)uVar2);
  this->finished_ = true;
  SVar4.data_ = (this->buffer_)._M_dataplus._M_p;
  SVar4.size_ = (this->buffer_)._M_string_length;
  return SVar4;
}

Assistant:

Slice BlockBuilder::Finish() {
  // Append restart array
  for (size_t i = 0; i < restarts_.size(); i++) {
    PutFixed32(&buffer_, restarts_[i]);
  }
  PutFixed32(&buffer_, restarts_.size());
  finished_ = true;
  return Slice(buffer_);
}